

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O0

void test_construct(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  unsigned_long unaff_retaddr;
  int k_1;
  int k;
  bitset_t *b;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  int iVar3;
  
  bitset = bitset_create();
  for (iVar3 = 0; iVar3 < 1000; iVar3 = iVar3 + 1) {
    bitset_set((bitset_t *)CONCAT44(iVar3,in_stack_fffffffffffffff0),
               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  compute_cardinality((bitset_t *)CONCAT44(iVar3,in_stack_fffffffffffffff0));
  _assert_true(unaff_retaddr,(char *)bitset,(char *)CONCAT44(iVar3,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
  bitset_count((bitset_t *)CONCAT44(iVar3,in_stack_fffffffffffffff0));
  _assert_true(unaff_retaddr,(char *)bitset,(char *)CONCAT44(iVar3,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
  for (iVar2 = 0; iVar2 < 3000; iVar2 = iVar2 + 1) {
    _Var1 = bitset_get(bitset,(long)iVar2);
    _assert_true(unaff_retaddr,(char *)bitset,(char *)CONCAT44(iVar3,iVar2),(uint)_Var1);
  }
  bitset_free((bitset_t *)0x10266c);
  return;
}

Assistant:

DEFINE_TEST(test_construct) {
    bitset_t *b = bitset_create();
    for (int k = 0; k < 1000; ++k) bitset_set(b, 3 * k);
    assert_true(compute_cardinality(b) == 1000);
    assert_true(bitset_count(b) == 1000);
    for (int k = 0; k < 3 * 1000; ++k)
        assert_true(bitset_get(b, k) == (k / 3 * 3 == k));
    bitset_free(b);
}